

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cpp
# Opt level: O0

void __thiscall
jsonnet::internal::anon_unknown_0::Parser_TestInvalidLocalInTuple_Test::
~Parser_TestInvalidLocalInTuple_Test(Parser_TestInvalidLocalInTuple_Test *this)

{
  void *in_RDI;
  
  ~Parser_TestInvalidLocalInTuple_Test((Parser_TestInvalidLocalInTuple_Test *)0x19f068);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(Parser, TestInvalidLocalInTuple)
{
    testParseError("{local 1 = 3, true}",
                   R"(test:1:8: expected token IDENTIFIER but got (NUMBER, "1"))");
    testParseError("{local foo = 1, local foo = 2, true}",
                   "test:1:23-26: duplicate local var: foo");
    testParseError("{local foo(a b) = 1, a: true}",
                   "test:1:14: expected a comma before next function parameter.");
    testParseError("{local foo(a): 1, a: true}", "test:1:14: expected operator = but got :");
    testParseError("{local foo(a) = (a b), a: true}",
                   R"_(test:1:20: expected token ")" but got (IDENTIFIER, "b"))_");
}